

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlDocPtr htmlCtxtReadFile(htmlParserCtxtPtr ctxt,char *filename,char *encoding,int options)

{
  xmlParserInputPtr input_00;
  xmlParserInputPtr input;
  int options_local;
  char *encoding_local;
  char *filename_local;
  htmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (htmlParserCtxtPtr)0x0) {
    ctxt_local = (htmlParserCtxtPtr)0x0;
  }
  else {
    htmlCtxtReset(ctxt);
    htmlCtxtUseOptions(ctxt,options);
    input_00 = xmlCtxtNewInputFromUrl(ctxt,filename,(char *)0x0,encoding,0);
    if (input_00 == (xmlParserInputPtr)0x0) {
      ctxt_local = (htmlParserCtxtPtr)0x0;
    }
    else {
      ctxt_local = (htmlParserCtxtPtr)htmlCtxtParseDocument(ctxt,input_00);
    }
  }
  return (htmlDocPtr)ctxt_local;
}

Assistant:

htmlDocPtr
htmlCtxtReadFile(htmlParserCtxtPtr ctxt, const char *filename,
                const char *encoding, int options)
{
    xmlParserInputPtr input;

    if (ctxt == NULL)
        return (NULL);

    htmlCtxtReset(ctxt);
    htmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromUrl(ctxt, filename, NULL, encoding, 0);
    if (input == NULL)
        return(NULL);

    return(htmlCtxtParseDocument(ctxt, input));
}